

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourcePositional::~IfcLightSourcePositional
          (IfcLightSourcePositional *this)

{
  ~IfcLightSourcePositional(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

IfcLightSourcePositional() : Object("IfcLightSourcePositional") {}